

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * sqlite3Utf16to8(sqlite3 *db,void *z,int nByte,u8 enc)

{
  char *pcVar1;
  long in_FS_OFFSET;
  MemValue local_58;
  char *pcStack_50;
  undefined8 local_48;
  sqlite3 *psStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 0;
  local_28 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_58.r = 0.0;
  pcStack_50 = (char *)0x0;
  psStack_40 = db;
  sqlite3VdbeMemSetStr((Mem *)&local_58,(char *)z,(long)nByte,'\x02',(_func_void_void_ptr *)0x0);
  sqlite3VdbeChangeEncoding((Mem *)&local_58,1);
  pcVar1 = pcStack_50;
  if (db->mallocFailed != '\0') {
    sqlite3VdbeMemRelease((Mem *)&local_58);
    pcVar1 = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return pcVar1;
}

Assistant:

SQLITE_PRIVATE char *sqlite3Utf16to8(sqlite3 *db, const void *z, int nByte, u8 enc){
  Mem m;
  memset(&m, 0, sizeof(m));
  m.db = db;
  sqlite3VdbeMemSetStr(&m, z, nByte, enc, SQLITE_STATIC);
  sqlite3VdbeChangeEncoding(&m, SQLITE_UTF8);
  if( db->mallocFailed ){
    sqlite3VdbeMemRelease(&m);
    m.z = 0;
  }
  assert( (m.flags & MEM_Term)!=0 || db->mallocFailed );
  assert( (m.flags & MEM_Str)!=0 || db->mallocFailed );
  assert( m.z || db->mallocFailed );
  return m.z;
}